

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::has_filename(Twine *path,Style style)

{
  size_t sVar1;
  SmallString<128U> path_storage;
  reverse_iterator local_e0;
  SmallVectorImpl<char> local_b0;
  undefined1 local_a0 [128];
  
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_a0;
  local_e0.Path = Twine::toStringRef(path,&local_b0);
  local_e0.Position = local_e0.Path.Length;
  local_e0.Component.Data = (char *)0x0;
  local_e0.Component.Length = 0;
  local_e0.S = style;
  reverse_iterator::operator++(&local_e0);
  sVar1 = local_e0.Component.Length;
  if ((undefined1 *)
      local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_a0) {
    free(local_b0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return sVar1 != 0;
}

Assistant:

bool has_filename(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !filename(p, style).empty();
}